

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall el::base::Storage::setApplicationArguments(Storage *this,int argc,char **argv)

{
  CommandLineArgs *this_00;
  bool bVar1;
  int iVar2;
  EnumType EVar3;
  char *pcVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  allocator local_91;
  string local_90;
  Configurations c;
  undefined8 *puVar5;
  
  this_00 = &this->m_commandLineArgs;
  utils::CommandLineArgs::setArgs(this_00,argc,argv);
  VRegistry::setFromArgs(this->m_vRegistry,this_00);
  bVar1 = utils::CommandLineArgs::hasParamWithValue(this_00,"--default-log-file");
  if (bVar1) {
    c.m_configurationFile._M_dataplus._M_p = (pointer)&c.m_configurationFile.field_2;
    c.super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>.
    super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
    ._32_8_ = 0;
    c.super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>.
    super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
    .m_list = (vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>)0x0;
    c.super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>.
    super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
    ._17_7_ = 0;
    c.super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>.
    super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
    ._24_8_ = 0;
    c.super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>.
    super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
    .super_ThreadSafe._vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_0019fac0;
    c.m_configurationFile._M_string_length = 0;
    c.m_configurationFile.field_2._M_local_buf[0] = '\0';
    c.m_isFromFile = false;
    pcVar4 = utils::CommandLineArgs::getParamValue(this_00,"--default-log-file");
    std::__cxx11::string::string((string *)&local_90,pcVar4,&local_91);
    Configurations::setGlobally(&c,Filename,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    RegisteredLoggers::setDefaultConfigurations(this->m_registeredLoggers,&c);
    iVar2 = (*(this->m_registeredLoggers->
              super_Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).
              super_AbstractRegistry<el::Logger,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>_>
              .super_ThreadSafe._vptr_ThreadSafe[5])();
    puVar5 = (undefined8 *)CONCAT44(extraout_var,iVar2);
    while( true ) {
      iVar2 = (*(this->m_registeredLoggers->
                super_Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).
                super_AbstractRegistry<el::Logger,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>_>
                .super_ThreadSafe._vptr_ThreadSafe[6])();
      if (puVar5 == (undefined8 *)CONCAT44(extraout_var_00,iVar2)) break;
      Logger::configure((Logger *)puVar5[5],&c);
      puVar5 = (undefined8 *)*puVar5;
    }
    Configurations::~Configurations(&c);
  }
  bVar1 = utils::CommandLineArgs::hasParamWithValue(this_00,"--logging-flags");
  if (bVar1) {
    pcVar4 = utils::CommandLineArgs::getParamValue(this_00,"--logging-flags");
    EVar3 = atoi(pcVar4);
    this->m_flags = EVar3;
  }
  return;
}

Assistant:

void Storage::setApplicationArguments(int argc, char** argv) {
  m_commandLineArgs.setArgs(argc, argv);
  m_vRegistry->setFromArgs(commandLineArgs());
  // default log file
#if !defined(ELPP_DISABLE_LOG_FILE_FROM_ARG)
  if (m_commandLineArgs.hasParamWithValue(base::consts::kDefaultLogFileParam)) {
    Configurations c;
    c.setGlobally(ConfigurationType::Filename,
                  std::string(m_commandLineArgs.getParamValue(base::consts::kDefaultLogFileParam)));
    registeredLoggers()->setDefaultConfigurations(c);
    for (base::RegisteredLoggers::iterator it = registeredLoggers()->begin();
         it != registeredLoggers()->end(); ++it) {
      it->second->configure(c);
    }
  }
#endif  // !defined(ELPP_DISABLE_LOG_FILE_FROM_ARG)
#if defined(ELPP_LOGGING_FLAGS_FROM_ARG)
  if (m_commandLineArgs.hasParamWithValue(base::consts::kLoggingFlagsParam)) {
    int userInput = atoi(m_commandLineArgs.getParamValue(base::consts::kLoggingFlagsParam));
    if (ELPP_DEFAULT_LOGGING_FLAGS == 0x0) {
      m_flags = userInput;
    } else {
      base::utils::addFlag<base::type::EnumType>(userInput, &m_flags);
    }
  }
#endif  // defined(ELPP_LOGGING_FLAGS_FROM_ARG)
}